

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O0

void ssh_ntru_server_getpublic(ecdh_key *dh,BinarySink *bs)

{
  BinarySink *pBVar1;
  ptrlen pVar2;
  ntru_server_key *nk;
  BinarySink *bs_local;
  ecdh_key *dh_local;
  
  pBVar1 = bs->binarysink_;
  pVar2 = ptrlen_from_strbuf((strbuf *)dh[-3].vt);
  BinarySink_put_datapl(pBVar1,pVar2);
  pBVar1 = bs->binarysink_;
  pVar2 = ptrlen_from_strbuf((strbuf *)dh[-2].vt);
  BinarySink_put_datapl(pBVar1,pVar2);
  ecdh_key_getpublic((ecdh_key *)dh[-1].vt,bs);
  return;
}

Assistant:

static void ssh_ntru_server_getpublic(ecdh_key *dh, BinarySink *bs)
{
    ntru_server_key *nk = container_of(dh, ntru_server_key, ek);

    /*
     * In the server, this function is called after getkey, so we
     * already have all our pieces prepared. Just concatenate them all
     * into the 'server's public data' string to go in ECDH_REPLY.
     */
    put_datapl(bs, ptrlen_from_strbuf(nk->ciphertext_encoded));
    put_datapl(bs, ptrlen_from_strbuf(nk->confirmation_hash));
    ecdh_key_getpublic(nk->curve25519, bs);
}